

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeSetPagerFlags(Btree *p,uint pgFlags)

{
  int *piVar1;
  BtShared *pBVar2;
  Pager *pPVar3;
  int extraout_EAX;
  uint uVar4;
  byte bVar5;
  bool bVar6;
  
  pBVar2 = p->pBt;
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pPVar3 = pBVar2->pPager;
  if (pPVar3->tempFile == '\0') {
    uVar4 = pgFlags & 7;
    pPVar3->noSync = uVar4 == 1;
    pPVar3->fullSync = 2 < uVar4;
    bVar6 = uVar4 == 4;
  }
  else {
    pPVar3->noSync = '\x01';
    pPVar3->fullSync = '\0';
    bVar6 = false;
  }
  pPVar3->extraSync = bVar6;
  if (pPVar3->noSync == '\0') {
    if ((pgFlags & 8) == 0) {
      pPVar3->syncFlags = '\x02';
    }
    else {
      pPVar3->syncFlags = '\x03';
    }
  }
  else {
    pPVar3->syncFlags = '\0';
  }
  bVar5 = pPVar3->syncFlags * '\x04';
  pPVar3->walSyncFlags = bVar5;
  if (pPVar3->fullSync != '\0') {
    pPVar3->walSyncFlags = bVar5 | pPVar3->syncFlags;
  }
  if (((pgFlags & 0x10) != 0) && (pPVar3->noSync == '\0')) {
    pPVar3->walSyncFlags = pPVar3->walSyncFlags | 0xc;
  }
  pPVar3->doNotSpill = pPVar3->doNotSpill & 0xfe | (pgFlags & 0x20) == 0;
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
      return extraout_EAX;
    }
  }
  return (int)pPVar3;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeSetPagerFlags(
  Btree *p,              /* The btree to set the safety level on */
  unsigned pgFlags       /* Various PAGER_* flags */
){
  BtShared *pBt = p->pBt;
  assert( sqlite3_mutex_held(p->db->mutex) );
  sqlite3BtreeEnter(p);
  sqlite3PagerSetFlags(pBt->pPager, pgFlags);
  sqlite3BtreeLeave(p);
  return SQLITE_OK;
}